

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_adj.cpp
# Opt level: O2

void Omega_h::find_matches_deg<2,int>
               (LOs *a2fv,Read<int> *av2v,Read<int> *bv2v,Adj *v2b,Write<int> *a2b_out,
               Write<signed_char> *codes_out,bool allow_duplicates)

{
  Alloc *pAVar1;
  int size_in;
  ulong uVar2;
  size_t sVar3;
  ScopedTimer omega_h_scoped_function_timer;
  Write<signed_char> codes;
  Read<signed_char> vb_codes;
  LOs vb2b;
  LOs v2vb;
  type f;
  ScopedTimer local_142;
  allocator local_141;
  Write<int> local_140;
  Write<signed_char> local_130;
  Write<int> *local_120;
  string local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  type local_b8;
  
  std::__cxx11::string::string
            ((string *)&local_f8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
             ,(allocator *)&local_140);
  std::operator+(&local_d8,&local_f8,":");
  std::__cxx11::to_string(&local_118,0x169);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b8,
                 &local_d8,&local_118);
  local_120 = a2b_out;
  begin_code("find_matches_deg",(char *)local_b8.a2fv.write_.shared_alloc_.alloc);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  pAVar1 = (a2fv->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar3 = pAVar1->size;
  }
  else {
    sVar3 = (ulong)pAVar1 >> 3;
  }
  size_in = (int)(sVar3 >> 2);
  pAVar1 = (av2v->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    uVar2 = pAVar1->size;
  }
  else {
    uVar2 = (ulong)pAVar1 >> 3;
  }
  if (size_in * 2 == (int)(uVar2 >> 2)) {
    Write<int>::Write((Write<int> *)&local_d8,(Write<int> *)v2b);
    Write<int>::Write((Write<int> *)&local_f8,&(v2b->super_Graph).ab2b.write_);
    Write<signed_char>::Write((Write<signed_char> *)&local_118,&(v2b->codes).write_);
    std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_130);
    Write<int>::Write(&local_140,size_in,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::string((string *)&local_b8,"",&local_141);
    Write<signed_char>::Write(&local_130,size_in,(string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_b8);
    Write<int>::Write((Write<int> *)&local_b8,&a2fv->write_);
    Write<int>::Write(&local_b8.v2vb.write_,(Write<int> *)&local_d8);
    Write<int>::Write(&local_b8.vb2b.write_,(Write<int> *)&local_f8);
    Write<signed_char>::Write(&local_b8.vb_codes.write_,(Write<signed_char> *)&local_118);
    Write<int>::Write(&local_b8.av2v.write_,&av2v->write_);
    Write<int>::Write(&local_b8.bv2v.write_,&bv2v->write_);
    Write<int>::Write(&local_b8.a2b,&local_140);
    Write<signed_char>::Write(&local_b8.codes,&local_130);
    local_b8.allow_duplicates = allow_duplicates;
    parallel_for<Omega_h::find_matches_deg<2,int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)::_lambda(int)_1_>
              (size_in,&local_b8);
    Write<int>::operator=(local_120,&local_140);
    Write<signed_char>::operator=(codes_out,&local_130);
    find_matches_deg<2,int>(Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Read<int>,Omega_h::Adj,Omega_h::Write<int>*,Omega_h::Write<signed_char>*,bool)
    ::{lambda(int)#1}::~Write((_lambda_int__1_ *)&local_b8);
    Write<signed_char>::~Write(&local_130);
    Write<int>::~Write(&local_140);
    Write<signed_char>::~Write((Write<signed_char> *)&local_118);
    Write<int>::~Write((Write<int> *)&local_f8);
    Write<int>::~Write((Write<int> *)&local_d8);
    ScopedTimer::~ScopedTimer(&local_142);
    return;
  }
  fail("assertion %s failed at %s +%d\n","na * deg == av2v.size()",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_adj.cpp"
       ,0x16b);
}

Assistant:

void find_matches_deg(LOs const a2fv, Read<T> const av2v,
    Read<T> const bv2v, Adj const v2b, Write<LO>* a2b_out, Write<I8>* codes_out,
    bool const allow_duplicates) {
  OMEGA_H_TIME_FUNCTION;
  LO const na = a2fv.size();
  OMEGA_H_CHECK(na * deg == av2v.size());
  LOs const v2vb = v2b.a2ab;
  LOs const vb2b = v2b.ab2b;
  Read<I8> const vb_codes = v2b.codes;
  Write<LO> a2b(na);
  Write<I8> codes(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto const fv = a2fv[a];
    auto const a_begin = a * deg;
    auto const vb_begin = v2vb[fv];
    auto const vb_end = v2vb[fv + 1];
    bool found = false;
    for (LO vb = vb_begin; vb < vb_end; ++vb) {
      auto const b = vb2b[vb];
      auto const vb_code = vb_codes[vb];
      auto const which_down = code_which_down(vb_code);
      auto const b_begin = b * deg;
      I8 match_code;
      if (IsMatch<deg>::eval(
              av2v, a_begin, bv2v, b_begin, which_down, &match_code)) {
        OMEGA_H_CHECK(!found);  // there can't be more than one!
        a2b[a] = b;
        codes[a] = match_code;
        found = true;
        if (allow_duplicates) break;
      }
    }
    (void)found;
    OMEGA_H_CHECK(found);  // there can't be less than one!
  };
  parallel_for(na, std::move(f));
  *a2b_out = a2b;
  *codes_out = codes;
}